

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

MetadataOwner * google::protobuf::anon_unknown_0::MetadataOwner::Instance(void)

{
  int iVar1;
  MetadataOwner *in_stack_ffffffffffffffe0;
  
  if ((anonymous_namespace)::MetadataOwner::Instance()::res == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::MetadataOwner::Instance()::res);
    if (iVar1 != 0) {
      operator_new(0x40);
      MetadataOwner(in_stack_ffffffffffffffe0);
      Instance::res =
           internal::OnShutdownDelete<google::protobuf::(anonymous_namespace)::MetadataOwner>
                     (in_stack_ffffffffffffffe0);
      __cxa_guard_release(&(anonymous_namespace)::MetadataOwner::Instance()::res);
    }
  }
  return Instance::res;
}

Assistant:

static MetadataOwner* Instance() {
    static MetadataOwner* res = OnShutdownDelete(new MetadataOwner);
    return res;
  }